

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
::alloc(array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        *this,int new_len)

{
  array<int,_allocator_default<int>_> *paVar1;
  int in_ESI;
  array<int,_allocator_default<int>_> *in_RDI;
  int i;
  int end;
  array<int,_allocator_default<int>_> *new_list;
  int local_30;
  int local_2c;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI->list_size = in_ESI;
  paVar1 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(new_list._4_4_);
  if (in_RDI->num_elements < in_RDI->list_size) {
    local_2c = in_RDI->num_elements;
  }
  else {
    local_2c = in_RDI->list_size;
  }
  for (iVar2 = 0; iVar2 < local_2c; iVar2 = iVar2 + 1) {
    array<int,_allocator_default<int>_>::operator=
              ((array<int,_allocator_default<int>_> *)CONCAT44(local_2c,iVar2),in_RDI);
  }
  allocator_default<array<int,_allocator_default<int>_>_>::free_array
            ((array<int,_allocator_default<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (in_RDI->num_elements < in_RDI->list_size) {
    local_30 = in_RDI->num_elements;
  }
  else {
    local_30 = in_RDI->list_size;
  }
  in_RDI->num_elements = local_30;
  in_RDI->list = (int *)paVar1;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}